

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O1

void __thiscall
duckdb::roaring::ContainerMetadataCollection::AddBitsetContainer(ContainerMetadataCollection *this)

{
  pointer *ppuVar1;
  iterator __position;
  uchar local_9;
  
  AddContainerType(this,false,false);
  local_9 = 0xf9;
  __position._M_current =
       (this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&(this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
               __position,&local_9);
  }
  else {
    *__position._M_current = 0xf9;
    ppuVar1 = &(this->cardinality).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  this->arrays_in_segment = this->arrays_in_segment + 1;
  this->count_in_segment = this->count_in_segment + 1;
  return;
}

Assistant:

void ContainerMetadataCollection::AddBitsetContainer() {
	AddContainerType(false, false);
	cardinality.push_back(BITSET_CONTAINER_SENTINEL_VALUE);
	arrays_in_segment++;
	count_in_segment++;
}